

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

double * __thiscall cxxopts::OptionValue::as<double>(OptionValue *this)

{
  bool bVar1;
  element_type *peVar2;
  abstract_value<double> *this_00;
  double *pdVar3;
  bool local_32;
  allocator local_31;
  string local_30;
  OptionValue *local_10;
  OptionValue *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->m_value,(nullptr_t)0x0);
  if (bVar1) {
    local_32 = this->m_long_name != (string *)0x0;
    if (local_32) {
      std::__cxx11::string::string((string *)&local_30,(string *)this->m_long_name);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_30,"",&local_31);
    }
    local_32 = !local_32;
    throw_or_mimic<cxxopts::option_has_no_value_exception>(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (local_32) {
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
    }
  }
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&this->m_value);
  this_00 = (abstract_value<double> *)
            __dynamic_cast(peVar2,&Value::typeinfo,&values::standard_value<double>::typeinfo,0);
  if (this_00 != (abstract_value<double> *)0x0) {
    pdVar3 = values::abstract_value<double>::get(this_00);
    return pdVar3;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
    as() const
    {
      if (m_value == nullptr) {
          throw_or_mimic<option_has_no_value_exception>(
              m_long_name == nullptr ? "" : *m_long_name);
      }

#ifdef CXXOPTS_NO_RTTI
      return static_cast<const values::standard_value<T>&>(*m_value).get();
#else
      return dynamic_cast<const values::standard_value<T>&>(*m_value).get();
#endif
    }